

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

void lj_cdata_free(global_State *g,GCcdata *cd)

{
  ushort uVar1;
  uint uVar2;
  undefined4 *puVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 *in_RSI;
  long in_RDI;
  CTSize sz;
  CType *ct;
  GCobj *root;
  CType *ct_1;
  uint local_c0;
  uint *local_98;
  
  if ((*(byte *)(in_RSI + 1) & 0x10) == 0) {
    if ((*(byte *)(in_RSI + 1) & 0x80) == 0) {
      for (local_98 = (uint *)(*(long *)(ulong)*(uint *)(in_RDI + 0x194) +
                              (ulong)*(ushort *)((long)in_RSI + 6) * 0x10); *local_98 >> 0x1c == 8;
          local_98 = (uint *)(*(long *)(ulong)*(uint *)(in_RDI + 0x194) +
                             (ulong)(*local_98 & 0xffff) * 0x10)) {
      }
      if (*local_98 >> 0x1c < 6) {
        local_c0 = local_98[1];
      }
      else {
        local_c0 = 8;
      }
      lVar4 = (ulong)local_c0 + 8;
      *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar4;
      *(long *)(in_RDI + 0x90) = lVar4 + *(long *)(in_RDI + 0x90);
      (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),in_RSI,lVar4,0);
      *(long *)(in_RDI + 0xe0) = *(long *)(in_RDI + 0xe0) + -1;
    }
    else {
      uVar1 = *(ushort *)(in_RSI + -2);
      uVar2 = in_RSI[-1] + (uint)*(ushort *)((long)in_RSI + -6);
      *(uint *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - uVar2;
      *(ulong *)(in_RDI + 0x90) = (ulong)uVar2 + *(long *)(in_RDI + 0x90);
      (**(code **)(in_RDI + 0x40))
                (*(undefined8 *)(in_RDI + 0x48),(long)in_RSI - (long)(int)(uint)uVar1,(ulong)uVar2,0
                );
      *(long *)(in_RDI + 0xe0) = *(long *)(in_RDI + 0xe0) + -1;
    }
  }
  else {
    *(byte *)(in_RSI + 1) = *(byte *)(in_RSI + 1) & 0xf8 | *(byte *)(in_RDI + 0x58) & 3;
    *(byte *)(in_RSI + 1) = *(byte *)(in_RSI + 1) | 8;
    puVar3 = (undefined4 *)(ulong)*(uint *)(in_RDI + 0x74);
    uVar5 = SUB84(in_RSI,0);
    if (puVar3 == (undefined4 *)0x0) {
      *in_RSI = uVar5;
      *(undefined4 *)(in_RDI + 0x74) = uVar5;
    }
    else {
      *in_RSI = *puVar3;
      *puVar3 = uVar5;
      *(undefined4 *)(in_RDI + 0x74) = uVar5;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_cdata_free(global_State *g, GCcdata *cd)
{
  if (LJ_UNLIKELY(cd->marked & LJ_GC_CDATA_FIN)) {
    GCobj *root;
    makewhite(g, obj2gco(cd));
    markfinalized(obj2gco(cd));
    if ((root = gcref(g->gc.mmudata)) != NULL) {
      setgcrefr(cd->nextgc, root->gch.nextgc);
      setgcref(root->gch.nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    } else {
      setgcref(cd->nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    }
  } else if (LJ_LIKELY(!cdataisv(cd))) {
    CType *ct = ctype_raw(ctype_ctsG(g), cd->ctypeid);
    CTSize sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_PTR;
    lj_assertG(ctype_hassize(ct->info) || ctype_isfunc(ct->info) ||
	       ctype_isextern(ct->info), "free of ctype without a size");
    lj_mem_free(g, cd, sizeof(GCcdata) + sz);
    g->gc.cdatanum--;
  } else {
    lj_mem_free(g, memcdatav(cd), sizecdatav(cd));
    g->gc.cdatanum--;
  }
}